

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  char cVar4;
  int64_t iVar5;
  invalid_argument *this;
  shared_ptr<fasttext::FastText> fasttext;
  Autotune autotune;
  string outputFileName;
  Args a;
  ofstream ofs;
  shared_ptr<fasttext::FastText> local_430;
  undefined1 local_420 [64];
  string local_3e0;
  Args local_3c0;
  undefined1 *local_220;
  filebuf local_218 [8];
  undefined1 local_210 [232];
  ios_base local_128 [264];
  
  ::fasttext::Args::Args(&local_3c0);
  ::fasttext::Args::parseArgs(&local_3c0,args);
  local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (FastText *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::FastText,std::allocator<fasttext::FastText>>
            (&local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FastText **)&local_430,(allocator<fasttext::FastText> *)&local_220);
  local_3e0._M_string_length = 0;
  local_3e0.field_2._M_local_buf[0] = '\0';
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  bVar3 = ::fasttext::Args::hasAutotune(&local_3c0);
  if (bVar3) {
    iVar5 = ::fasttext::Args::getAutotuneModelSize(&local_3c0);
    if (iVar5 != -1) {
      local_220 = local_210;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,local_3c0.output._M_dataplus._M_p,
                 local_3c0.output._M_dataplus._M_p + local_3c0.output._M_string_length);
      std::__cxx11::string::append((char *)&local_220);
      goto LAB_0011c2ab;
    }
  }
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,local_3c0.output._M_dataplus._M_p,
             local_3c0.output._M_dataplus._M_p + local_3c0.output._M_string_length);
  std::__cxx11::string::append((char *)&local_220);
LAB_0011c2ab:
  std::__cxx11::string::operator=((string *)&local_3e0,(string *)&local_220);
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  std::ofstream::ofstream(&local_220,(string *)&local_3e0,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::ofstream::close();
    bVar3 = ::fasttext::Args::hasAutotune(&local_3c0);
    if (bVar3) {
      ::fasttext::Autotune::Autotune((Autotune *)local_420,&local_430);
      ::fasttext::Autotune::train((Autotune *)local_420,&local_3c0);
      ::fasttext::Autotune::~Autotune((Autotune *)local_420);
    }
    else {
      ::fasttext::FastText::train
                (local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&local_3c0);
    }
    ::fasttext::FastText::saveModel
              (local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_3e0);
    peVar2 = local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1 = (element_type *)(local_420 + 0x10);
    local_420._0_8_ = peVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_420,local_3c0.output._M_dataplus._M_p,
               local_3c0.output._M_dataplus._M_p + local_3c0.output._M_string_length);
    std::__cxx11::string::append(local_420);
    ::fasttext::FastText::saveVectors(peVar2,(string *)local_420);
    if ((element_type *)local_420._0_8_ != peVar1) {
      operator_delete((void *)local_420._0_8_);
    }
    peVar2 = local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_420._0_8_ = peVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_420,local_3c0.output._M_dataplus._M_p,
               local_3c0.output._M_dataplus._M_p + local_3c0.output._M_string_length);
    std::__cxx11::string::append(local_420);
    ::fasttext::FastText::saveVectorsMod(peVar2,(string *)local_420);
    if ((element_type *)local_420._0_8_ != peVar1) {
      operator_delete((void *)local_420._0_8_);
    }
    peVar2 = local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_3c0.saveSubwords == true) {
      local_420._0_8_ = peVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_420,local_3c0.output._M_dataplus._M_p,
                 local_3c0.output._M_dataplus._M_p + local_3c0.output._M_string_length);
      std::__cxx11::string::append(local_420);
      ::fasttext::FastText::saveSubWordVectors(peVar2,(string *)local_420);
      if ((element_type *)local_420._0_8_ != peVar1) {
        operator_delete((void *)local_420._0_8_);
      }
    }
    peVar2 = local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_3c0.saveOutput == true) {
      local_420._0_8_ = peVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_420,local_3c0.output._M_dataplus._M_p,
                 local_3c0.output._M_dataplus._M_p + local_3c0.output._M_string_length);
      std::__cxx11::string::append(local_420);
      ::fasttext::FastText::saveOutput(peVar2,(string *)local_420);
      if ((element_type *)local_420._0_8_ != peVar1) {
        operator_delete((void *)local_420._0_8_);
      }
    }
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    if (local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_430.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ::fasttext::Args::~Args(&local_3c0);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420,
                 &local_3e0," cannot be opened for saving.");
  std::invalid_argument::invalid_argument(this,(string *)local_420);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  std::shared_ptr<FastText> fasttext = std::make_shared<FastText>();
  std::string outputFileName;

  if (a.hasAutotune() &&
      a.getAutotuneModelSize() != Args::kUnlimitedModelSize) {
    outputFileName = a.output + ".ftz";
  } else {
    outputFileName = a.output + ".bin";
  }
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  if (a.hasAutotune()) {
    Autotune autotune(fasttext);
    autotune.train(a);
  } else {
    fasttext->train(a);
  }
  fasttext->saveModel(outputFileName);
  fasttext->saveVectors(a.output + ".vec");
  fasttext->saveVectorsMod(a.output + "_mod.vec");
  if (a.saveSubwords) {
    fasttext->saveSubWordVectors(a.output + "_subwords.vec");
  }
  if (a.saveOutput) {
    fasttext->saveOutput(a.output + ".output");
  }
}